

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O1

void correct(double *x)

{
  if (*x <= -1e+100 && *x != -1e+100) {
    *x = -1e+100;
  }
  if (1e+100 < *x) {
    *x = 1e+100;
  }
  if ((0.0 < *x) && (*x < 1e-100)) {
    *x = 1e-100;
  }
  if ((*x < 0.0) && (-1e-100 < *x)) {
    *x = -1e-100;
  }
  return;
}

Assistant:

void correct(double &x) {
    if (x < -MAX_DOUBLE) {
        x = -MAX_DOUBLE;
    }
    if (x > MAX_DOUBLE) {
        x = MAX_DOUBLE;
    }
    if (x > 0 && x < MIN_ACCURACY) {
        x = MIN_ACCURACY;
    }
    if (x < 0 && x > -MIN_ACCURACY) {
        x = -MIN_ACCURACY;
    }
}